

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

StringTree * __thiscall
capnp::JsonCodec::Impl::encodeList
          (StringTree *__return_storage_ptr__,Impl *this,Array<kj::StringTree> *elements,
          bool hasMultilineElement,uint indent,bool *multiline,bool hasPrefix)

{
  ulong uVar1;
  undefined7 in_register_00000009;
  Repeat<char> *params_1;
  ulong uVar2;
  undefined4 in_register_00000084;
  long lVar3;
  size_t sVar4;
  Array<kj::StringTree> *__range2;
  char *pcVar5;
  StringPtr delim;
  char *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  String ownDelim;
  String ownPrefix;
  StringTree local_78;
  Repeat<char> indentSpace;
  
  params_1 = (Repeat<char> *)CONCAT71(in_register_00000009,hasMultilineElement);
  uVar2 = 0;
  for (lVar3 = 0; elements->size_ * 0x38 - lVar3 != 0; lVar3 = lVar3 + 0x38) {
    uVar1 = *(ulong *)((long)&elements->ptr->size_ + lVar3);
    if (uVar2 <= uVar1) {
      uVar2 = uVar1;
    }
  }
  local_d8 = "";
  local_d0 = 1;
  local_c8._0_8_ = "";
  local_c8._8_8_ = (char *)0x1;
  ownPrefix.content.disposer = (ArrayDisposer *)0x0;
  ownDelim.content.disposer = (ArrayDisposer *)0x0;
  ownPrefix.content.ptr = (char *)0x0;
  ownPrefix.content.size_ = 0;
  ownDelim.content.ptr = (char *)0x0;
  ownDelim.content.size_ = 0;
  if (this->prettyPrint == false) {
    local_d8 = "";
    local_d0 = 1;
    local_c8._0_8_ = "";
    local_c8._8_8_ = (char *)0x1;
    sVar4 = 2;
    pcVar5 = ",";
  }
  else if ((elements->size_ < 2) || (uVar2 < 0x33 && !hasMultilineElement)) {
    local_d8 = "";
    local_d0 = 1;
    local_c8._0_8_ = "";
    local_c8._8_8_ = (char *)0x1;
    sVar4 = 3;
    pcVar5 = ", ";
  }
  else {
    indentSpace.count = (size_t)(indent * 2 + 2);
    indentSpace.value = ' ';
    kj::str<char_const(&)[3],kj::Repeat<char>&>
              ((String *)&local_78,(kj *)",\n",&indentSpace.value,params_1);
    kj::Array<char>::operator=(&ownDelim.content,(Array<char> *)&local_78);
    pcVar5 = "";
    if (ownDelim.content.size_ != 0) {
      pcVar5 = ownDelim.content.ptr;
    }
    sVar4 = ownDelim.content.size_ + (ownDelim.content.size_ == 0);
    kj::Array<char>::~Array((Array<char> *)&local_78);
    *multiline = true;
    if (hasPrefix) {
      kj::str<char_const(&)[2],kj::Repeat<char>&>
                ((String *)&local_78,(kj *)0x4d4a94,&indentSpace.value,params_1);
      kj::Array<char>::operator=(&ownPrefix.content,(Array<char> *)&local_78);
      local_d8 = ownPrefix.content.ptr;
      if (ownPrefix.content.size_ == 0) {
        local_d8 = "";
      }
      local_d0 = ownPrefix.content.size_ + (ownPrefix.content.size_ == 0);
      kj::Array<char>::~Array((Array<char> *)&local_78);
    }
    else {
      local_d8 = " ";
      local_d0 = 2;
    }
    local_c8._0_8_ = " ";
    local_c8._8_8_ = (char *)0x2;
  }
  delim.content.size_ = sVar4;
  delim.content.ptr = pcVar5;
  kj::StringTree::StringTree(&local_78,elements,delim);
  kj::strTree<kj::StringPtr&,kj::StringTree,kj::StringPtr&>
            (__return_storage_ptr__,(kj *)&local_d8,(StringPtr *)&local_78,(StringTree *)local_c8,
             (StringPtr *)CONCAT44(in_register_00000084,indent));
  kj::StringTree::~StringTree(&local_78);
  kj::Array<char>::~Array(&ownDelim.content);
  kj::Array<char>::~Array(&ownPrefix.content);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree encodeList(kj::Array<kj::StringTree> elements,
                            bool hasMultilineElement, uint indent, bool& multiline,
                            bool hasPrefix) const {
    size_t maxChildSize = 0;
    for (auto& e: elements) maxChildSize = kj::max(maxChildSize, e.size());

    kj::StringPtr prefix;
    kj::StringPtr delim;
    kj::StringPtr suffix;
    kj::String ownPrefix;
    kj::String ownDelim;
    if (!prettyPrint) {
      // No whitespace.
      delim = ",";
      prefix = "";
      suffix = "";
    } else if ((elements.size() > 1) && (hasMultilineElement || maxChildSize > 50)) {
      // If the array contained any multi-line elements, OR it contained sufficiently long
      // elements, then put each element on its own line.
      auto indentSpace = kj::repeat(' ', (indent + 1) * 2);
      delim = ownDelim = kj::str(",\n", indentSpace);
      multiline = true;
      if (hasPrefix) {
        // We're producing a multi-line list, and the first line has some garbage in front of it.
        // Therefore, move the first element to the next line.
        prefix = ownPrefix = kj::str("\n", indentSpace);
      } else {
        prefix = " ";
      }
      suffix = " ";
    } else {
      // Put everything on one line, but add spacing between elements for legibility.
      delim = ", ";
      prefix = "";
      suffix = "";
    }

    return kj::strTree(prefix, kj::StringTree(kj::mv(elements), delim), suffix);
  }